

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O1

void __thiscall URI::URI(URI *this,char *uri)

{
  QueryParam *pQVar1;
  
  this->mRelative = false;
  this->mModified = false;
  this->mModifiedQuery = false;
  (this->mFullString)._M_dataplus._M_p = (pointer)&(this->mFullString).field_2;
  (this->mFullString)._M_string_length = 0;
  (this->mFullString).field_2._M_local_buf[0] = '\0';
  (this->mQueryString)._M_dataplus._M_p = (pointer)&(this->mQueryString).field_2;
  (this->mQueryString)._M_string_length = 0;
  (this->mQueryString).field_2._M_local_buf[0] = '\0';
  (this->mScheme)._M_dataplus._M_p = (pointer)&(this->mScheme).field_2;
  (this->mScheme)._M_string_length = 0;
  (this->mScheme).field_2._M_local_buf[0] = '\0';
  (this->mAuthority)._M_dataplus._M_p = (pointer)&(this->mAuthority).field_2;
  (this->mAuthority)._M_string_length = 0;
  (this->mAuthority).field_2._M_local_buf[0] = '\0';
  (this->mPath)._M_dataplus._M_p = (pointer)&(this->mPath).field_2;
  (this->mPath)._M_string_length = 0;
  (this->mPath).field_2._M_local_buf[0] = '\0';
  (this->mFragment)._M_dataplus._M_p = (pointer)&(this->mFragment).field_2;
  (this->mFragment)._M_string_length = 0;
  (this->mFragment).field_2._M_local_buf[0] = '\0';
  (this->mQueryParams).mAllocated = 0x20;
  pQVar1 = (QueryParam *)operator_new__(0x800);
  (this->mQueryParams).mData = pQVar1;
  (this->mQueryParams).mSize = 0;
  strlen(uri);
  std::__cxx11::string::_M_replace((ulong)&this->mFullString,0,(char *)0x0,(ulong)uri);
  parseString(this);
  return;
}

Assistant:

URI::URI( const char *uri )
:	mRelative(false),
	mModified(false),
	mModifiedQuery(false)
{
	mFullString = uri;
	parseString();
}